

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.cpp
# Opt level: O1

void getB64SignatureForHash(char *sigb64,uint8_t *privateKey,uint8_t *hash,size_t length)

{
  uECC_Curve curve;
  uint8_t signature [64];
  uint8_t auStack_68 [32];
  byte local_48;
  
  do {
    curve = uECC_secp256k1();
    uECC_sign(privateKey,hash,(uint)length,auStack_68,curve);
  } while (0x79 < local_48);
  Base64Class::encode((Base64Class *)&Base64,sigb64,(char *)auStack_68,0x40);
  return;
}

Assistant:

void getB64SignatureForHash(char * sigb64, const uint8_t * privateKey, const uint8_t * hash,size_t length){

	uint8_t signature[64];
	do {
		uECC_sign(privateKey, hash, length, signature, uECC_secp256k1());
//		FEED_WATCHDOG;
	} while (signature[32] > 0x79);//hub would refuse a high-s signature
	Base64.encode(sigb64, (char *) signature, 64);

}